

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

uint64 Clasp::StrRef::create(char *str,size_t len)

{
  undefined4 *puVar1;
  
  puVar1 = (undefined4 *)malloc(len + 5);
  *puVar1 = 0;
  memcpy(puVar1 + 1,str,len);
  *(undefined1 *)((long)puVar1 + len + 4) = 0;
  LOCK();
  *puVar1 = 1;
  UNLOCK();
  return (uint64)puVar1;
}

Assistant:

static uint64      create(const char* str, std::size_t len) {
		char*   mem = (char*)malloc(sizeof(RefCount) + len + 1);
		RefCount* p = new (mem) RefCount();
		std::memcpy(mem + sizeof(RefCount), str, len);
		mem[sizeof(RefCount) + len] = 0;
		*p = 1;
		return static_cast<uint64>(reinterpret_cast<uintp>(mem));
	}